

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O1

TRef lj_record_idx(jit_State *J,RecordIndex *ix)

{
  int *piVar1;
  uint16_t *ptr;
  double dVar2;
  uint8_t uVar3;
  char cVar4;
  byte bVar5;
  IRIns *pIVar6;
  IRIns IVar7;
  TRef *pTVar8;
  TValue *pTVar9;
  bool bVar10;
  int iVar11;
  TRef TVar12;
  uint uVar13;
  uint uVar14;
  TRef TVar15;
  BCReg func;
  cTValue *pcVar16;
  cTValue *pcVar17;
  ushort uVar18;
  ulong uVar19;
  ptrdiff_t nargs;
  bool bVar20;
  ulong uVar21;
  uint ref;
  code *cont;
  uint uVar22;
  GCtab *pGVar23;
  IRRef1 IVar24;
  IRRef1 local_68;
  uint local_64;
  
  pTVar9 = &ix->keyv;
  ptr = &J[-1].penalty[0x32].val;
  do {
    if ((ix->tab & 0x1f000000) == 0xb000000) {
      if ((pTVar9->u64 == 0xffffffffffffffff) ||
         (((ushort)(pTVar9->u64 >> 0x30) < 0xfff9 && (NAN(pTVar9->n))))) {
        if (ix->val != 0) {
          lj_trace_err(J,LJ_TRERR_STORENN);
        }
        if ((ix->key & 0x8000) == 0) {
          if (ix->idxchain == 0) {
            return 0x7fff;
          }
          iVar11 = lj_record_mm_lookup(J,ix,MM_index);
          if (iVar11 == 0) {
            return 0x7fff;
          }
          goto LAB_0014f59a;
        }
      }
      pGVar23 = (GCtab *)((ix->tabv).u64 & 0x7fffffffffff);
      pcVar17 = lj_tab_get(J->L,pGVar23,pTVar9);
      ix->oldv = pcVar17;
      uVar14 = ix->key;
      if ((uVar14 >> 0x18 & 0x1e) - 0xe < 6) {
        dVar2 = pTVar9->n;
        uVar13 = (int)dVar2;
        if ((double)(int)dVar2 != dVar2) {
          uVar13 = 0x8000001;
        }
        if (NAN((double)(int)dVar2) || NAN(dVar2)) {
          uVar13 = 0x8000001;
        }
        if (uVar13 < 0x8000001) {
          TVar15 = lj_opt_narrow_index(J,uVar14);
          (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45130008;
          TVar12 = lj_opt_fold(J);
          if (uVar13 < pGVar23->asize) {
            rec_idx_abc(J,TVar12,TVar15,pGVar23->asize);
            (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
            *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45090006;
            TVar12 = lj_opt_fold(J);
            (J->fold).ins.field_0.ot = 0x3809;
            (J->fold).ins.field_0.op1 = (IRRef1)TVar12;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar15;
            uVar13 = lj_opt_fold(J);
            bVar20 = false;
          }
          else {
            (J->fold).ins.field_0.ot = 0x693;
            (J->fold).ins.field_0.op1 = (IRRef1)TVar12;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar15;
            lj_opt_fold(J);
            bVar20 = true;
            uVar13 = uVar13 | uVar14 & 0x8000;
            if (uVar13 == 0) {
              uVar14 = lj_ir_knum_u64(J,0);
            }
          }
        }
        else {
          bVar20 = true;
          if ((short)uVar14 < 0) {
            if (pGVar23->asize != 0) {
              lj_trace_err(J,LJ_TRERR_NYITMIX);
            }
            (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
            *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45130008;
            uVar13 = lj_opt_fold(J);
            TVar15 = lj_ir_kint(J,0);
            (J->fold).ins.field_0.ot = 0x893;
            (J->fold).ins.field_0.op1 = (IRRef1)uVar13;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar15;
            lj_opt_fold(J);
          }
        }
        ref = 0;
        uVar3 = '\0';
        if (bVar20) goto LAB_0014edb5;
      }
      else {
LAB_0014edb5:
        if (pGVar23->hmask == 0) {
          (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45130009;
          TVar15 = lj_opt_fold(J);
          TVar12 = lj_ir_kint(J,0);
          (J->fold).ins.field_0.ot = 0x893;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar15;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar12;
          lj_opt_fold(J);
          uVar13 = lj_ir_kptr_(J,IR_KKPTR,ptr);
          ref = 0;
          uVar3 = '\0';
        }
        else {
          if ((uVar14 >> 0x18 & 0x1f) - 0xf < 5) {
            (J->fold).ins.field_0.op1 = (IRRef1)uVar14;
            *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b0e01d3;
            uVar14 = lj_opt_fold(J);
          }
          if (((short)(IRRef1)uVar14 < 0) ||
             (uVar21 = (long)ix->oldv - (pGVar23->node).ptr64,
             0x17ffe8 < uVar21 || (ulong)pGVar23->hmask * 0x18 < uVar21)) {
            uVar3 = '\0';
            ref = 0;
            TVar15 = ix->tab;
            (J->fold).ins.field_0.ot = 0x3a09;
            (J->fold).ins.field_0.op1 = (IRRef1)TVar15;
            (J->fold).ins.field_0.op2 = (IRRef1)uVar14;
            uVar13 = lj_opt_fold(J);
          }
          else {
            ref = (J->cur).nins;
            uVar3 = (J->guardemit).irt;
            (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
            *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45130009;
            TVar15 = lj_opt_fold(J);
            TVar12 = lj_ir_kint(J,pGVar23->hmask);
            (J->fold).ins.field_0.ot = 0x893;
            (J->fold).ins.field_0.op1 = (IRRef1)TVar15;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar12;
            lj_opt_fold(J);
            (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
            *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45090007;
            TVar15 = lj_opt_fold(J);
            TVar12 = lj_ir_kslot(J,uVar14,(IRRef)(uVar21 / 0x18));
            (J->fold).ins.field_0.ot = 0x3989;
            (J->fold).ins.field_0.op1 = (IRRef1)TVar15;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar12;
            uVar13 = lj_opt_fold(J);
          }
        }
      }
      local_68 = (IRRef1)uVar13;
      pIVar6 = (J->cur).ir;
      uVar13 = uVar13 & 0xffff;
      cVar4 = *(char *)((long)pIVar6 + (ulong)uVar13 * 8 + 5);
      if (cVar4 == '\x1a') {
        pcVar17 = *(cTValue **)&pIVar6[(ulong)uVar13 + 1].i;
      }
      else {
        pcVar17 = ix->oldv;
      }
      uVar22 = cVar4 == '8' ^ 0x43;
      uVar14 = ix->val;
      if (uVar14 == 0) {
        uVar14 = ~(uint)(pcVar17->it64 >> 0x2f);
        if ((ulong)(pcVar17->it64 >> 0x2f) < 0xfffffffffffffff2) {
          uVar14 = 0xe;
        }
        if (pcVar17 == (cTValue *)ptr) {
          TVar15 = lj_ir_kptr_(J,IR_KKPTR,ptr);
          (J->fold).ins.field_0.ot = 0x889;
          (J->fold).ins.field_0.op1 = local_68;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar15;
          lj_opt_fold(J);
          TVar15 = 0x7fff;
        }
        else {
          (J->fold).ins.field_0.ot = (IROpT)uVar22 * 0x100 + (short)uVar14 + 0x80;
          (J->fold).ins.field_0.op1 = local_68;
          (J->fold).ins.field_0.op2 = 0;
          TVar15 = lj_opt_fold(J);
        }
        if ((TVar15 & 0xffff) < ref) {
          lj_ir_rollback(J,ref);
          (J->guardemit).irt = uVar3;
        }
        if ((uVar14 == 0) && (ix->idxchain != 0)) {
          iVar11 = lj_record_mm_lookup(J,ix,MM_index);
          bVar20 = true;
          if (iVar11 == 0) goto LAB_0014f32f;
        }
        else {
LAB_0014f32f:
          local_64 = TVar15;
          if (uVar14 < 3) {
            local_64 = uVar14 * 0x1000001 ^ 0x7fff;
          }
          bVar20 = false;
        }
        if (!bVar20) {
          return local_64;
        }
      }
      else {
        pGVar23 = *(GCtab **)(((ix->tabv).u64 & 0x7fffffffffff) + 0x20);
        bVar5 = *(byte *)((long)&ix->key + 3);
        if (uVar13 < ref) {
          lj_ir_rollback(J,ref);
          (J->guardemit).irt = uVar3;
        }
        bVar20 = (uVar14 & 0x1f000000) != 0 && (bVar5 & 0x1f) - 4 < 9;
        if (pcVar17->u64 == 0xffffffffffffffff) {
          if ((((ix->idxchain == 0) || (pGVar23 == (GCtab *)0x0)) ||
              (pcVar16 = lj_tab_getstr(pGVar23,(GCstr *)J[-1].penalty[0x3e].pc.ptr64),
              pcVar16 == (cTValue *)0x0)) || (pcVar16->u64 == 0xffffffffffffffff)) {
            if (cVar4 == ':') {
              TVar15 = lj_ir_kptr_(J,IR_KKPTR,ptr);
              (J->fold).ins.field_0.ot = (ushort)(pcVar17 != (cTValue *)ptr) << 8 | 0x889;
              (J->fold).ins.field_0.op1 = local_68;
              (J->fold).ins.field_0.op2 = (IRRef1)TVar15;
              goto LAB_0014f1ab;
            }
          }
          else {
            (J->fold).ins.field_0.ot = (ushort)(uVar22 << 8) | 0x80;
            (J->fold).ins.field_0.op1 = local_68;
            (J->fold).ins.field_0.op2 = 0;
LAB_0014f1ab:
            lj_opt_fold(J);
          }
          if ((ix->idxchain == 0) || (iVar11 = lj_record_mm_lookup(J,ix,MM_newindex), iVar11 == 0))
          {
            iVar11 = 0;
            bVar10 = true;
            if (pcVar17 == (cTValue *)ptr) {
              uVar14 = ix->key;
              IVar24 = (IRRef1)uVar14;
              if ((uVar14 >> 0x18 & 0x1f) - 0xf < 5) {
                (J->fold).ins.field_0.op1 = IVar24;
                *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b0e01d3;
                uVar14 = lj_opt_fold(J);
              }
              else if (((uVar14 & 0x1f000000) == 0xe000000) && ((short)IVar24 < 0)) {
                (J->fold).ins.field_0.ot = 0x88e;
                (J->fold).ins.field_0.op1 = IVar24;
                (J->fold).ins.field_0.op2 = IVar24;
                lj_opt_fold(J);
              }
              TVar15 = ix->tab;
              (J->fold).ins.field_0.ot = 0x3b09;
              (J->fold).ins.field_0.op1 = (IRRef1)TVar15;
              (J->fold).ins.field_0.op2 = (IRRef1)uVar14;
              TVar15 = lj_opt_fold(J);
              local_68 = (IRRef1)TVar15;
              bVar20 = false;
              iVar11 = 0;
            }
          }
          else {
            iVar11 = 4;
            bVar10 = false;
          }
          if (bVar10) goto LAB_0014f463;
        }
        else {
          iVar11 = lj_opt_fwd_wasnonnil(J,(IROpT)uVar22,uVar13);
          if (iVar11 == 0) {
            if (cVar4 == ':') {
              TVar15 = lj_ir_kptr_(J,IR_KKPTR,ptr);
              (J->fold).ins.field_0.ot = 0x989;
              (J->fold).ins.field_0.op1 = local_68;
              (J->fold).ins.field_0.op2 = (IRRef1)TVar15;
              lj_opt_fold(J);
            }
            if (ix->idxchain != 0) {
              if (pGVar23 == (GCtab *)0x0) {
                (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
                *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x450b0005;
                TVar15 = lj_opt_fold(J);
                TVar12 = lj_ir_knull(J,IRT_TAB);
                (J->fold).ins.field_0.ot = 0x88b;
                (J->fold).ins.field_0.op1 = (IRRef1)TVar15;
                (J->fold).ins.field_0.op2 = (IRRef1)TVar12;
              }
              else {
                uVar18 = ~(ushort)(int)(pcVar17->it64 >> 0x2f) | 0x80;
                if ((ulong)(pcVar17->it64 >> 0x2f) < 0xfffffffffffffff2) {
                  uVar18 = 0x8e;
                }
                (J->fold).ins.field_0.ot = uVar18 + (short)(uVar22 << 8);
                (J->fold).ins.field_0.op1 = local_68;
                (J->fold).ins.field_0.op2 = 0;
              }
              lj_opt_fold(J);
            }
          }
          else {
            bVar20 = false;
          }
LAB_0014f463:
          if ((ix->val >> 0x18 & 0x1f) - 0xf < 5) {
            (J->fold).ins.field_0.op1 = (IRRef1)ix->val;
            *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b0e01d3;
            TVar15 = lj_opt_fold(J);
            ix->val = TVar15;
          }
          TVar15 = ix->val;
          (J->fold).ins.field_0.ot = (ushort)(uVar22 << 8) | (byte)(TVar15 >> 0x18) & 0x7f1f | 0x800
          ;
          (J->fold).ins.field_0.op1 = local_68;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar15;
          lj_opt_fold(J);
          if ((bVar20) || ((*(byte *)((long)&ix->val + 3) & 0x1f) - 4 < 9)) {
            (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
            *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x58000000;
            lj_opt_fold(J);
          }
          uVar14 = ix->key;
          if ((uVar14 & 0x1f000000) == 0x4000000) {
            if ((-1 < (short)uVar14) &&
               (IVar7 = (J->cur).ir[(ulong)(uVar14 & 0x7fff) + 1],
               *(IRIns *)&J[-1].penalty[0x3d].val != IVar7)) {
              uVar21 = 0;
              do {
                uVar19 = uVar21;
                if (uVar19 == 5) goto LAB_0014f57f;
                uVar21 = uVar19 + 1;
              } while (*(IRIns *)((long)J + uVar19 * 8 + -0x128) != IVar7);
              if (4 < uVar19) goto LAB_0014f57f;
            }
            (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
            *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x3e09000a;
            TVar15 = lj_opt_fold(J);
            TVar12 = lj_ir_kint(J,0);
            (J->fold).ins.field_0.ot = 0x4d10;
            (J->fold).ins.field_0.op1 = (IRRef1)TVar15;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar12;
            lj_opt_fold(J);
          }
LAB_0014f57f:
          J->needsnap = '\x01';
          local_64 = 0;
          iVar11 = 1;
        }
        if (iVar11 != 4) {
          return local_64;
        }
      }
    }
    else {
      iVar11 = lj_record_mm_lookup(J,ix,(uint)(ix->val != 0));
      if (iVar11 == 0) {
        lj_trace_err(J,LJ_TRERR_NOMM);
      }
    }
LAB_0014f59a:
    uVar14 = ix->mobj & 0x1f000000;
    if (uVar14 == 0x8000000) {
      cont = lj_cont_nop;
      if (ix->val == 0) {
        cont = lj_cont_ra;
      }
      func = rec_mm_prep(J,cont);
      pTVar8 = J->base;
      pTVar9 = J->L->base;
      pTVar8[func] = ix->mobj;
      pTVar8[(ulong)func + 2] = ix->tab;
      pTVar8[(ulong)func + 3] = ix->key;
      pTVar9[func].u64 = (ix->mobjv).u64 & 0x7fffffffffff | 0xfffb800000000000;
      pTVar9[(ulong)func + 2].gcr.gcptr64 = (uint64_t)ix->tabv;
      pTVar9[(ulong)func + 3] = ix->keyv;
      if (ix->val == 0) {
        nargs = 2;
      }
      else {
        pTVar8[(ulong)func + 4] = ix->val;
        pTVar9[(ulong)func + 4] = ix->valv;
        nargs = 3;
      }
      lj_record_call(J,func,nargs);
      return 0;
    }
    if (((((ix->mt == 0x7fff) && (ix->val == 0)) && ((ix->tab & 0x1f000000) == 0xc000000)) &&
        ((uVar14 == 0xb000000 && (*(char *)(((ix->tabv).u64 & 0x7fffffffffff) + 10) == '\x03')))) &&
       ((ix->key & 0x1f008000) == 0x4000000)) {
      pcVar17 = lj_tab_getstr((GCtab *)((ix->mobjv).u64 & 0x7fffffffffff),
                              (GCstr *)((ix->keyv).u64 & 0x7fffffffffff));
      TVar15 = lj_record_constify(J,pcVar17);
      if (TVar15 != 0) {
        return TVar15;
      }
    }
    ix->tab = ix->mobj;
    ix->tabv = ix->mobjv;
    piVar1 = &ix->idxchain;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      lj_trace_err(J,LJ_TRERR_IDXLOOP);
    }
  } while( true );
}

Assistant:

TRef lj_record_idx(jit_State *J, RecordIndex *ix)
{
  TRef xref;
  IROp xrefop, loadop;
  IRRef rbref;
  IRType1 rbguard;
  cTValue *oldv;

  while (!tref_istab(ix->tab)) { /* Handle non-table lookup. */
    /* Never call raw lj_record_idx() on non-table. */
    lj_assertJ(ix->idxchain != 0, "bad usage");
    if (!lj_record_mm_lookup(J, ix, ix->val ? MM_newindex : MM_index))
      lj_trace_err(J, LJ_TRERR_NOMM);
  handlemm:
    if (tref_isfunc(ix->mobj)) {  /* Handle metamethod call. */
      BCReg func = rec_mm_prep(J, ix->val ? lj_cont_nop : lj_cont_ra);
      TRef *base = J->base + func + LJ_FR2;
      TValue *tv = J->L->base + func + LJ_FR2;
      base[-LJ_FR2] = ix->mobj; base[1] = ix->tab; base[2] = ix->key;
      setfuncV(J->L, tv-LJ_FR2, funcV(&ix->mobjv));
      copyTV(J->L, tv+1, &ix->tabv);
      copyTV(J->L, tv+2, &ix->keyv);
      if (ix->val) {
	base[3] = ix->val;
	copyTV(J->L, tv+3, &ix->valv);
	lj_record_call(J, func, 3);  /* mobj(tab, key, val) */
	return 0;
      } else {
	lj_record_call(J, func, 2);  /* res = mobj(tab, key) */
	return 0;  /* No result yet. */
      }
    }
#if LJ_HASBUFFER
    /* The index table of buffer objects is treated as immutable. */
    if (ix->mt == TREF_NIL && !ix->val &&
	tref_isudata(ix->tab) && udataV(&ix->tabv)->udtype == UDTYPE_BUFFER &&
	tref_istab(ix->mobj) && tref_isstr(ix->key) && tref_isk(ix->key)) {
      cTValue *val = lj_tab_getstr(tabV(&ix->mobjv), strV(&ix->keyv));
      TRef tr = lj_record_constify(J, val);
      if (tr) return tr;  /* Specialize to the value, i.e. a method. */
    }
#endif
    /* Otherwise retry lookup with metaobject. */
    ix->tab = ix->mobj;
    copyTV(J->L, &ix->tabv, &ix->mobjv);
    if (--ix->idxchain == 0)
      lj_trace_err(J, LJ_TRERR_IDXLOOP);
  }

  /* First catch nil and NaN keys for tables. */
  if (tvisnil(&ix->keyv) || (tvisnum(&ix->keyv) && tvisnan(&ix->keyv))) {
    if (ix->val)  /* Better fail early. */
      lj_trace_err(J, LJ_TRERR_STORENN);
    if (tref_isk(ix->key)) {
      if (ix->idxchain && lj_record_mm_lookup(J, ix, MM_index))
	goto handlemm;
      return TREF_NIL;
    }
  }

  /* Record the key lookup. */
  xref = rec_idx_key(J, ix, &rbref, &rbguard);
  xrefop = IR(tref_ref(xref))->o;
  loadop = xrefop == IR_AREF ? IR_ALOAD : IR_HLOAD;
  /* The lj_meta_tset() inconsistency is gone, but better play safe. */
  oldv = xrefop == IR_KKPTR ? (cTValue *)ir_kptr(IR(tref_ref(xref))) : ix->oldv;

  if (ix->val == 0) {  /* Indexed load */
    IRType t = itype2irt(oldv);
    TRef res;
    if (oldv == niltvg(J2G(J))) {
      emitir(IRTG(IR_EQ, IRT_PGC), xref, lj_ir_kkptr(J, niltvg(J2G(J))));
      res = TREF_NIL;
    } else {
      res = emitir(IRTG(loadop, t), xref, 0);
    }
    if (tref_ref(res) < rbref) {  /* HREFK + load forwarded? */
      lj_ir_rollback(J, rbref);  /* Rollback to eliminate hmask guard. */
      J->guardemit = rbguard;
    }
    if (t == IRT_NIL && ix->idxchain && lj_record_mm_lookup(J, ix, MM_index))
      goto handlemm;
    if (irtype_ispri(t)) res = TREF_PRI(t);  /* Canonicalize primitives. */
    return res;
  } else {  /* Indexed store. */
    GCtab *mt = tabref(tabV(&ix->tabv)->metatable);
    int keybarrier = tref_isgcv(ix->key) && !tref_isnil(ix->val);
    if (tref_ref(xref) < rbref) {  /* HREFK forwarded? */
      lj_ir_rollback(J, rbref);  /* Rollback to eliminate hmask guard. */
      J->guardemit = rbguard;
    }
    if (tvisnil(oldv)) {  /* Previous value was nil? */
      /* Need to duplicate the hasmm check for the early guards. */
      int hasmm = 0;
      if (ix->idxchain && mt) {
	cTValue *mo = lj_tab_getstr(mt, mmname_str(J2G(J), MM_newindex));
	hasmm = mo && !tvisnil(mo);
      }
      if (hasmm)
	emitir(IRTG(loadop, IRT_NIL), xref, 0);  /* Guard for nil value. */
      else if (xrefop == IR_HREF)
	emitir(IRTG(oldv == niltvg(J2G(J)) ? IR_EQ : IR_NE, IRT_PGC),
	       xref, lj_ir_kkptr(J, niltvg(J2G(J))));
      if (ix->idxchain && lj_record_mm_lookup(J, ix, MM_newindex)) {
	lj_assertJ(hasmm, "inconsistent metamethod handling");
	goto handlemm;
      }
      lj_assertJ(!hasmm, "inconsistent metamethod handling");
      if (oldv == niltvg(J2G(J))) {  /* Need to insert a new key. */
	TRef key = ix->key;
	if (tref_isinteger(key)) {  /* NEWREF needs a TValue as a key. */
	  key = emitir(IRTN(IR_CONV), key, IRCONV_NUM_INT);
	} else if (tref_isnum(key)) {
	  if (tref_isk(key)) {
	    if (tvismzero(&ix->keyv))
	      key = lj_ir_knum_zero(J);  /* Canonicalize -0.0 to +0.0. */
	  } else {
	    emitir(IRTG(IR_EQ, IRT_NUM), key, key);  /* Check for !NaN. */
	  }
	}
	xref = emitir(IRT(IR_NEWREF, IRT_PGC), ix->tab, key);
	keybarrier = 0;  /* NEWREF already takes care of the key barrier. */
#ifdef LUAJIT_ENABLE_TABLE_BUMP
	if ((J->flags & JIT_F_OPT_SINK))  /* Avoid a separate flag. */
	  rec_idx_bump(J, ix);
#endif
      }
    } else if (!lj_opt_fwd_wasnonnil(J, loadop, tref_ref(xref))) {
      /* Cannot derive that the previous value was non-nil, must do checks. */
      if (xrefop == IR_HREF)  /* Guard against store to niltv. */
	emitir(IRTG(IR_NE, IRT_PGC), xref, lj_ir_kkptr(J, niltvg(J2G(J))));
      if (ix->idxchain) {  /* Metamethod lookup required? */
	/* A check for NULL metatable is cheaper (hoistable) than a load. */
	if (!mt) {
	  TRef mtref = emitir(IRT(IR_FLOAD, IRT_TAB), ix->tab, IRFL_TAB_META);
	  emitir(IRTG(IR_EQ, IRT_TAB), mtref, lj_ir_knull(J, IRT_TAB));
	} else {
	  IRType t = itype2irt(oldv);
	  emitir(IRTG(loadop, t), xref, 0);  /* Guard for non-nil value. */
	}
      }
    } else {
      keybarrier = 0;  /* Previous non-nil value kept the key alive. */
    }
    /* Convert int to number before storing. */
    if (!LJ_DUALNUM && tref_isinteger(ix->val))
      ix->val = emitir(IRTN(IR_CONV), ix->val, IRCONV_NUM_INT);
    emitir(IRT(loadop+IRDELTA_L2S, tref_type(ix->val)), xref, ix->val);
    if (keybarrier || tref_isgcv(ix->val))
      emitir(IRT(IR_TBAR, IRT_NIL), ix->tab, 0);
    /* Invalidate neg. metamethod cache for stores with certain string keys. */
    if (!nommstr(J, ix->key)) {
      TRef fref = emitir(IRT(IR_FREF, IRT_PGC), ix->tab, IRFL_TAB_NOMM);
      emitir(IRT(IR_FSTORE, IRT_U8), fref, lj_ir_kint(J, 0));
    }
    J->needsnap = 1;
    return 0;
  }
}